

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void highbd_convolve_2d_facade_compound
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  int in_ECX;
  uint16_t *in_RDX;
  int in_ESI;
  uint16_t *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar1;
  bool bVar2;
  InterpFilterParams *in_stack_00000008;
  InterpFilterParams *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  ConvolveParams *in_stack_00000028;
  _Bool need_y;
  int in_stack_00000030;
  _Bool need_x;
  
  bVar1 = in_stack_00000018 != 0;
  bVar2 = in_stack_00000020 != 0;
  if ((bVar1) || (bVar2)) {
    if ((!bVar1) || (bVar2)) {
      if ((bVar1) || (!bVar2)) {
        (*av1_highbd_dist_wtd_convolve_2d)
                  (in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,
                   in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
      }
      else {
        (*av1_highbd_dist_wtd_convolve_y)
                  (in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000010,in_stack_00000020,
                   in_stack_00000028,in_stack_00000030);
      }
    }
    else {
      (*av1_highbd_dist_wtd_convolve_x)
                (in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000018,
                 in_stack_00000028,in_stack_00000030);
    }
  }
  else {
    (*av1_highbd_dist_wtd_convolve_2d_copy)
              (in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000028,in_stack_00000030);
  }
  return;
}

Assistant:

static void highbd_convolve_2d_facade_compound(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride,
    const int w, const int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  const bool need_x = subpel_x_qn != 0;
  const bool need_y = subpel_y_qn != 0;
  if (!need_x && !need_y) {
    av1_highbd_dist_wtd_convolve_2d_copy(src, src_stride, dst, dst_stride, w, h,
                                         conv_params, bd);
  } else if (need_x && !need_y) {
    av1_highbd_dist_wtd_convolve_x(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params,
                                   bd);
  } else if (!need_x && need_y) {
    av1_highbd_dist_wtd_convolve_y(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn, conv_params,
                                   bd);
  } else {
    assert(need_x && need_y);
    av1_highbd_dist_wtd_convolve_2d(src, src_stride, dst, dst_stride, w, h,
                                    filter_params_x, filter_params_y,
                                    subpel_x_qn, subpel_y_qn, conv_params, bd);
  }
}